

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.hpp
# Opt level: O2

SmallIntegerValue Lodtalk::moduleRoundNeg(SmallIntegerValue dividend,SmallIntegerValue divisor)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  if (divisor != 0) {
    lVar3 = dividend % divisor;
    uVar2 = 0;
    if (0 < lVar3) {
      uVar2 = divisor;
    }
    uVar1 = lVar3 >> 0x3f & divisor;
    if (divisor < 0) {
      uVar1 = uVar2;
    }
    return uVar1 + lVar3;
  }
  __assert_fail("divisor != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/Math.hpp"
                ,0x2e,
                "SmallIntegerValue Lodtalk::moduleRoundNeg(SmallIntegerValue, SmallIntegerValue)");
}

Assistant:

inline SmallIntegerValue moduleRoundNeg(SmallIntegerValue dividend, SmallIntegerValue divisor)
{
    // This algorithm was taken from the Squeak VM.
    assert(divisor != 0);

    auto result = dividend % divisor;

    // Make sure the result has the same sign as the divisor.
    if (divisor < 0)
    {
        if (result > 0)
            result += divisor;
    }
    else
    {
        if (result < 0)
            result += divisor;
    }

    return result;
}